

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void __thiscall
FWeaponSlots::AddSlotDefault(FWeaponSlots *this,int slot,PClassWeapon *type,bool feedback)

{
  bool bVar1;
  ESlotDef EVar2;
  char *pcVar3;
  bool feedback_local;
  PClassWeapon *type_local;
  int slot_local;
  FWeaponSlots *this_local;
  
  if ((((type != (PClassWeapon *)0x0) &&
       (bVar1 = PClass::IsDescendantOf((PClass *)type,AWeapon::RegistrationInfo.MyClass), bVar1)) &&
      (EVar2 = AddDefaultWeapon(this,slot,type), EVar2 != SLOTDEF_Exists)) &&
     (((EVar2 != SLOTDEF_Added && (EVar2 == SLOTDEF_Full)) && (feedback)))) {
    pcVar3 = FName::GetChars(&(type->super_PClassInventory).super_PClassActor.super_PClass.
                              super_PNativeStruct.super_PStruct.super_PNamedType.TypeName);
    Printf("Could not add %s to slot %d\n",pcVar3,(ulong)(uint)slot);
  }
  return;
}

Assistant:

void FWeaponSlots::AddSlotDefault(int slot, PClassWeapon *type, bool feedback)
{
	if (type != NULL && type->IsDescendantOf(RUNTIME_CLASS(AWeapon)))
	{
		switch (AddDefaultWeapon(slot, type))
		{
		case SLOTDEF_Full:
			if (feedback)
			{
				Printf ("Could not add %s to slot %d\n", type->TypeName.GetChars(), slot);
			}
			break;

		default:
		case SLOTDEF_Added:
			break;

		case SLOTDEF_Exists:
			break;
		}
	}
}